

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

ssize_t __thiscall Buffer::write(Buffer *this,int __fd,void *__buf,size_t __n)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  char *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  char local_220 [8];
  ofstream file;
  string *path_local;
  Buffer *this_local;
  
  pcVar3 = (char *)std::__cxx11::string::c_str();
  _Var2 = std::operator|(_S_bin,_S_trunc);
  std::ofstream::ofstream(local_220,pcVar3,_Var2);
  bVar1 = std::ios::good();
  bVar5 = (bVar1 & 1) != 0;
  if (bVar5) {
    std::ostream::write(local_220,(long)this->data);
    std::ofstream::close();
  }
  uVar4 = std::ofstream::~ofstream(local_220);
  return CONCAT71((int7)((ulong)uVar4 >> 8),bVar5);
}

Assistant:

bool
Buffer::write(const std::string &path) {
  std::ofstream file(path.c_str(), std::ios::binary | std::ios::trunc);
  if (!file.good()) {
    return false;
  }

  file.write(reinterpret_cast<char*>(data), size);
  file.close();

  return true;
}